

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::rec_coface
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          vector<short,_std::allocator<short>_> *vertices,Siblings *curr_sib,int curr_nbVertices,
          vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
          *cofaces,bool star,int nbVertices)

{
  pointer psVar1;
  pointer psVar2;
  Siblings *curr_sib_00;
  short sVar3;
  pointer ppVar4;
  Siblings *curr_sib_01;
  Vertex_handle tmp;
  Simplex_handle simplex;
  short local_42;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *local_40;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
  local_38;
  
  if (curr_nbVertices <= nbVertices || star) {
    ppVar4 = (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    local_40 = this;
    local_38.m_ptr =
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
          *)ppVar4;
    while (local_38.m_ptr !=
           (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
            *)(ppVar4 + (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size)) {
      psVar1 = (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar2 = (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (psVar1 == psVar2) {
        if (((curr_nbVertices != nbVertices && !star) ||
            (std::
             vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
             ::push_back(cofaces,&local_38), star)) &&
           (curr_sib_01 = ((local_38.m_ptr)->second).children_,
           curr_sib_01->parent_ == (local_38.m_ptr)->first)) {
LAB_0014cb78:
          rec_coface(local_40,vertices,curr_sib_01,curr_nbVertices + 1,cofaces,star,nbVertices);
        }
      }
      else {
        sVar3 = (local_38.m_ptr)->first;
        if (sVar3 == psVar2[-1]) {
          if ((long)psVar2 - (long)psVar1 == 2 && (curr_nbVertices == nbVertices || star)) {
            std::
            vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
            ::push_back(cofaces,&local_38);
            if (!star) goto LAB_0014cb98;
            sVar3 = (local_38.m_ptr)->first;
          }
          curr_sib_00 = ((local_38.m_ptr)->second).children_;
          if (curr_sib_00->parent_ == sVar3) {
            psVar1 = (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            local_42 = psVar1[-1];
            (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_finish = psVar1 + -1;
            rec_coface(local_40,vertices,curr_sib_00,curr_nbVertices + 1,cofaces,star,nbVertices);
            std::vector<short,_std::allocator<short>_>::push_back(vertices,&local_42);
          }
        }
        else {
          if (psVar2[-1] < sVar3) {
            return;
          }
          curr_sib_01 = ((local_38.m_ptr)->second).children_;
          if (curr_sib_01->parent_ == sVar3) goto LAB_0014cb78;
        }
      }
LAB_0014cb98:
      boost::container::
      vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
      ::operator++(&local_38);
      ppVar4 = (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    }
  }
  return;
}

Assistant:

void rec_coface(std::vector<Vertex_handle> &vertices, Siblings const*curr_sib, int curr_nbVertices,
                  std::vector<Simplex_handle>& cofaces, bool star, int nbVertices) const {
    if (!(star || curr_nbVertices <= nbVertices))  // dimension of actual simplex <= nbVertices
      return;
    for (Simplex_handle simplex = curr_sib->members().begin(); simplex != curr_sib->members().end(); ++simplex) {
      if (vertices.empty()) {
        // If we reached the end of the vertices, and the simplex has more vertices than the given simplex
        // => we found a coface

        // Add a coface if we want the star or if the number of vertices of the current simplex matches with nbVertices
        bool addCoface = (star || curr_nbVertices == nbVertices);
        if (addCoface)
          cofaces.push_back(simplex);
        if ((!addCoface || star) && has_children(simplex))  // Rec call
          rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
      } else {
        if (simplex->first == vertices.back()) {
          // If curr_sib matches with the top vertex
          bool equalDim = (star || curr_nbVertices == nbVertices);  // dimension of actual simplex == nbVertices
          bool addCoface = vertices.size() == 1 && equalDim;
          if (addCoface)
            cofaces.push_back(simplex);
          if ((!addCoface || star) && has_children(simplex)) {
            // Rec call
            Vertex_handle tmp = vertices.back();
            vertices.pop_back();
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
            vertices.push_back(tmp);
          }
        } else if (simplex->first > vertices.back()) {
          return;
        } else {
          // (simplex->first < vertices.back()
          if (has_children(simplex))
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
        }
      }
    }
  }